

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O2

StringTree *
capnp::anon_unknown_2::print
          (StringTree *__return_storage_ptr__,Reader *value,Which which,Indent indent,PrintMode mode
          )

{
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  ArrayDisposer *pAVar1;
  byte *pbVar2;
  undefined8 uVar3;
  ReaderFor<bool> RVar4;
  Which WVar5;
  long lVar6;
  Indent IVar7;
  undefined6 in_register_00000012;
  char (*params) [22];
  char *pcVar8;
  ulong uVar9;
  undefined4 in_register_00000084;
  StringTree *pSVar10;
  bool bVar11;
  float fVar12;
  ReaderFor<DynamicEnum> RVar13;
  ArrayPtr<const_unsigned_char> bytes;
  ReaderFor<Text> RVar14;
  ArrayPtr<const_char> text;
  Indent indent_local;
  Field field;
  Vector<kj::StringTree> printedFields;
  ArrayBuilder<kj::StringTree> builder;
  FieldSubset unionFields;
  IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field> local_228;
  Maybe<capnp::StructSchema::Field> which_1;
  ArrayPtr<const_char> local_1d0;
  Array<kj::StringTree> local_1c0;
  StringTree unionValue;
  FieldSubset nonUnionFields;
  ArrayPtr<const_char> local_128;
  void *local_118;
  WirePointer *pWStack_110;
  StructDataBitCount local_108;
  StructPointerCount SStack_104;
  undefined2 uStack_102;
  int iStack_100;
  undefined4 uStack_fc;
  Reader fieldProto;
  StringTree local_b8;
  ReaderFor<capnp::DynamicStruct> structValue;
  Array<kj::StringTree> local_48;
  
  pcVar8 = (char *)CONCAT44(in_register_00000084,mode);
  params = (char (*) [22])CONCAT62(in_register_00000012,which);
  indent_local = indent;
  switch(value->type) {
  case UNKNOWN:
    kj::strTree<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x20c0b0,(char (*) [2])params);
    break;
  case VOID:
    kj::strTree<char_const(&)[5]>(__return_storage_ptr__,(kj *)"void",(char (*) [5])params);
    break;
  case BOOL:
    RVar4 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    pcVar8 = "false";
    if (RVar4) {
      pcVar8 = "true";
    }
    unionFields.parent.super_Schema.raw = (Schema)(Schema)pcVar8;
    kj::strTree<char_const*>(__return_storage_ptr__,(kj *)&unionFields,(char **)pcVar8);
    break;
  case INT:
    unionFields.parent.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(value);
    kj::strTree<long>(__return_storage_ptr__,(long *)&unionFields);
    break;
  case UINT:
    unionFields.parent.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(value);
    kj::strTree<unsigned_long>(__return_storage_ptr__,(unsigned_long *)&unionFields);
    break;
  case FLOAT:
    if (which == FLOAT32) {
      fVar12 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(value);
      unionFields.parent.super_Schema.raw._0_4_ = fVar12;
      kj::strTree<float>(__return_storage_ptr__,(float *)&unionFields);
    }
    else {
      unionFields.parent.super_Schema.raw =
           (Schema)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
      kj::strTree<double>(__return_storage_ptr__,(double *)&unionFields);
    }
    break;
  case TEXT:
    RVar14 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    text.size_ = RVar14.super_StringPtr.content.size_ - 1;
    nonUnionFields.parent.super_Schema.raw._0_1_ = 0x22;
    text.ptr = RVar14.super_StringPtr.content.ptr;
    kj::encodeCEscape((String *)&unionFields,text);
    which_1.ptr.isSet = true;
    kj::strTree<char,kj::String,char>
              (__return_storage_ptr__,(kj *)&nonUnionFields,(char *)&unionFields,(String *)&which_1,
               pcVar8);
    goto LAB_001b0bf9;
  case DATA:
    bytes = (ArrayPtr<const_unsigned_char>)
            DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(value);
    nonUnionFields.parent.super_Schema.raw._0_1_ = 0x22;
    kj::encodeCEscape((String *)&unionFields,bytes);
    which_1.ptr.isSet = true;
    kj::strTree<char,kj::String,char>
              (__return_storage_ptr__,(kj *)&nonUnionFields,(char *)&unionFields,(String *)&which_1,
               pcVar8);
LAB_001b0bf9:
    kj::Array<char>::~Array((Array<char> *)&unionFields);
    break;
  case LIST:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&nonUnionFields,value);
    WVar5 = LIST;
    if ((nonUnionFields.parent.super_Schema.raw._1_6_ & 0xff00) == 0) {
      WVar5 = (Which)CONCAT61(nonUnionFields.parent.super_Schema.raw._1_6_,
                              nonUnionFields.parent.super_Schema.raw._0_1_);
    }
    uVar9 = (ulong)nonUnionFields.list.reader._31_8_ >> 8 & 0xffffffff;
    builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(uVar9);
    builder.endPtr = builder.ptr + uVar9;
    builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    IVar7.amount = indent.amount + 1;
    if (indent.amount == 0) {
      IVar7.amount = 0;
    }
    structValue.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)&nonUnionFields;
    builder.pos = builder.ptr;
    for (structValue.reader.segment._0_4_ = 0; pAVar1 = builder.disposer, pSVar10 = builder.ptr,
        (StructDataBitCount)structValue.reader.segment != nonUnionFields.list.reader.structDataSize;
        structValue.reader.segment._0_4_ = (StructDataBitCount)structValue.reader.segment + 1) {
      capnp::_::IndexingIterator<const_capnp::DynamicList::Reader,_capnp::DynamicValue::Reader>::
      operator*((Reader *)&unionFields,
                (IndexingIterator<const_capnp::DynamicList::Reader,_capnp::DynamicValue::Reader> *)
                &structValue);
      print((StringTree *)&which_1,(Reader *)&unionFields,WVar5,IVar7,BARE);
      kj::StringTree::StringTree(builder.pos,(StringTree *)&which_1);
      builder.pos = builder.pos + 1;
      kj::StringTree::~StringTree((StringTree *)&which_1);
      DynamicValue::Reader::~Reader((Reader *)&unionFields);
    }
    lVar6 = (long)builder.pos - (long)builder.ptr;
    field.proto._reader.segment = (SegmentReader *)builder.disposer;
    builder._0_16_ = ZEXT816(0);
    builder.endPtr = (StringTree *)0x0;
    kj::ArrayBuilder<kj::StringTree>::dispose(&builder);
    which_1.ptr.isSet = true;
    local_48.ptr = pSVar10;
    local_48.disposer = pAVar1;
    field.parent.super_Schema.raw = (Schema)(RawBrandedSchema *)0x0;
    field.index = 0;
    field._12_4_ = 0;
    pcVar8 = (char *)0x0;
    local_48.size_ = lVar6 / 0x38;
    Indent::delimit((StringTree *)&unionFields,&indent_local,&local_48,mode,LIST);
    builder.ptr._0_1_ = 0x5d;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&which_1,(char *)&unionFields,(StringTree *)&builder,
               pcVar8);
    kj::StringTree::~StringTree((StringTree *)&unionFields);
    kj::Array<kj::StringTree>::~Array(&local_48);
    kj::Array<kj::StringTree>::~Array((Array<kj::StringTree> *)&field);
    break;
  case ENUM:
    RVar13 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
    which_1.ptr._0_8_ = RVar13.schema.super_Schema.raw;
    which_1.ptr.field_1._0_2_ = RVar13.value;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)&unionFields,(DynamicEnum *)&which_1);
    uVar3 = unionFields.list.reader._24_8_;
    pbVar2 = unionFields.list.reader.ptr;
    if ((char)unionFields.parent.super_Schema.raw == '\x01') {
      nonUnionFields._55_8_ = unionFields.indices;
      nonUnionFields.list.reader._31_8_ = unionFields.list.reader._32_8_;
      nonUnionFields.list.reader._39_8_ = unionFields.list.reader._40_8_;
      nonUnionFields.list.reader._15_8_ = unionFields.list.reader.ptr;
      nonUnionFields.list.reader._23_8_ = unionFields.list.reader._24_8_;
      nonUnionFields.parent.super_Schema.raw._7_1_ = SUB81(unionFields.list.reader.segment,0);
      nonUnionFields.list.reader.segment._0_7_ =
           (undefined7)((ulong)unionFields.list.reader.segment >> 8);
      nonUnionFields.list.reader._7_8_ = unionFields.list.reader.capTable;
      unionFields.list.reader._24_8_ = unionFields.indices;
      unionFields.list.reader.capTable = (CapTableReader *)unionFields.list.reader._32_8_;
      unionFields.list.reader.ptr = (byte *)unionFields.list.reader._40_8_;
      unionFields.parent.super_Schema.raw = (Schema)(Schema)pbVar2;
      unionFields.list.reader.segment = (SegmentReader *)uVar3;
      builder._0_16_ = capnp::schema::Enumerant::Reader::getName((Reader *)&unionFields);
      kj::strTree<capnp::Text::Reader>(__return_storage_ptr__,(kj *)&builder,builder.pos);
    }
    else {
      builder.ptr._0_1_ = 0x28;
      unionFields.parent.super_Schema.raw._0_2_ = which_1.ptr.field_1._0_2_;
      field.parent.super_Schema.raw._0_1_ = 0x29;
      kj::strTree<char,unsigned_short,char>
                (__return_storage_ptr__,(kj *)&builder,(char *)&unionFields,(unsigned_short *)&field
                 ,pcVar8);
    }
    break;
  case STRUCT:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&structValue,value);
    nonUnionFields.parent.super_Schema.raw._0_1_ = structValue.schema.super_Schema.raw._0_1_;
    nonUnionFields.parent.super_Schema.raw._1_6_ = structValue.schema.super_Schema.raw._1_6_;
    nonUnionFields.parent.super_Schema.raw._7_1_ = structValue.schema.super_Schema.raw._7_1_;
    StructSchema::getUnionFields(&unionFields,&nonUnionFields.parent);
    which_1.ptr._0_8_ = structValue.schema.super_Schema.raw;
    StructSchema::getNonUnionFields(&nonUnionFields,(StructSchema *)&which_1);
    uVar9 = (ulong)((nonUnionFields.size_ + 1) - (uint)(unionFields.size_ == 0));
    printedFields.builder.ptr =
         kj::_::HeapArrayDisposer::allocateUninitialized<kj::StringTree>(uVar9);
    printedFields.builder.endPtr = printedFields.builder.ptr + uVar9;
    printedFields.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    printedFields.builder.pos = printedFields.builder.ptr;
    DynamicStruct::Reader::which(&which_1,&structValue);
    unionValue.branches.ptr = (Branch *)0x0;
    unionValue.branches.size_ = 0;
    unionValue.branches.disposer = (ArrayDisposer *)0x0;
    unionValue.text.content.size_ = 0;
    unionValue.text.content.disposer = (ArrayDisposer *)0x0;
    unionValue.size_ = 0;
    unionValue.text.content.ptr = (char *)0x0;
    if (which_1.ptr.isSet == true) {
      fieldProto._reader.dataSize = which_1.ptr.field_1._48_4_;
      fieldProto._reader.pointerCount = which_1.ptr.field_1._52_2_;
      fieldProto._reader._38_2_ = which_1.ptr.field_1._54_2_;
      uVar3 = fieldProto._reader._32_8_;
      fieldProto._reader._40_8_ = which_1.ptr.field_1._56_8_;
      fieldProto._reader.data = which_1.ptr.field_1.value.proto._reader.data;
      fieldProto._reader.pointers = which_1.ptr.field_1.value.proto._reader.pointers;
      fieldProto._reader.segment = which_1.ptr.field_1.value.proto._reader.segment;
      fieldProto._reader.capTable = which_1.ptr.field_1.value.proto._reader.capTable;
      fieldProto._reader.dataSize = (StructDataBitCount)which_1.ptr.field_1._48_8_;
      bVar11 = fieldProto._reader.dataSize < 0x20;
      fieldProto._reader._32_8_ = uVar3;
      if (((bVar11) || (*(short *)((long)which_1.ptr.field_1.value.proto._reader.data + 2) != -1))
         || (field_00.parent.super_Schema.raw._2_6_ = which_1.ptr.field_1._2_6_,
            field_00.parent.super_Schema.raw._0_2_ = which_1.ptr.field_1._0_2_,
            field_00._12_4_ = which_1.ptr.field_1._12_4_,
            field_00.index = which_1.ptr.field_1.value.index,
            field_00.proto._reader.segment = which_1.ptr.field_1.value.proto._reader.segment,
            field_00.proto._reader.capTable = which_1.ptr.field_1.value.proto._reader.capTable,
            field_00.proto._reader.data = which_1.ptr.field_1.value.proto._reader.data,
            field_00.proto._reader.pointers = which_1.ptr.field_1.value.proto._reader.pointers,
            field_00.proto._reader.dataSize = which_1.ptr.field_1._48_4_,
            field_00.proto._reader.pointerCount = which_1.ptr.field_1._52_2_,
            field_00.proto._reader._38_2_ = which_1.ptr.field_1._54_2_,
            field_00.proto._reader._40_8_ = which_1.ptr.field_1._56_8_,
            bVar11 = DynamicStruct::Reader::has(&structValue,field_00,NON_NULL), bVar11)) {
        local_128 = (ArrayPtr<const_char>)capnp::schema::Field::Reader::getName(&fieldProto);
        field_01.parent.super_Schema.raw._2_6_ = which_1.ptr.field_1._2_6_;
        field_01.parent.super_Schema.raw._0_2_ = which_1.ptr.field_1._0_2_;
        field_01._12_4_ = which_1.ptr.field_1._12_4_;
        field_01.index = which_1.ptr.field_1.value.index;
        field_01.proto._reader.segment = which_1.ptr.field_1.value.proto._reader.segment;
        field_01.proto._reader.capTable = which_1.ptr.field_1.value.proto._reader.capTable;
        field_01.proto._reader.data = which_1.ptr.field_1.value.proto._reader.data;
        field_01.proto._reader.pointers = which_1.ptr.field_1.value.proto._reader.pointers;
        field_01.proto._reader.dataSize = which_1.ptr.field_1._48_4_;
        field_01.proto._reader.pointerCount = which_1.ptr.field_1._52_2_;
        field_01.proto._reader._38_2_ = which_1.ptr.field_1._54_2_;
        field_01.proto._reader._40_8_ = which_1.ptr.field_1._56_8_;
        DynamicStruct::Reader::get((Reader *)&builder,&structValue,field_01);
        WVar5 = whichFieldType(&which_1.ptr.field_1.value);
        IVar7.amount = indent.amount + 1;
        if (indent.amount == 0) {
          IVar7.amount = 0;
        }
        pSVar10 = (StringTree *)0x1;
        print(&local_b8,(Reader *)&builder,WVar5,IVar7,PREFIXED);
        kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                  ((StringTree *)&field,(kj *)&local_128,(Reader *)" = ",(char (*) [4])&local_b8,
                   pSVar10);
        kj::StringTree::operator=(&unionValue,(StringTree *)&field);
        kj::StringTree::~StringTree((StringTree *)&field);
        kj::StringTree::~StringTree(&local_b8);
        DynamicValue::Reader::~Reader((Reader *)&builder);
      }
      else if (which_1.ptr.isSet == true) {
        which_1.ptr._0_8_ = which_1.ptr._0_8_ & 0xffffffffffffff00;
      }
    }
    local_228.index = 0;
    IVar7.amount = indent.amount + 1;
    if (indent.amount == 0) {
      IVar7.amount = 0;
    }
    local_228.container = &nonUnionFields;
    for (; local_228.index != nonUnionFields.size_; local_228.index = local_228.index + 1) {
      capnp::_::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
      ::operator*(&field,&local_228);
      if ((which_1.ptr.isSet == true) && (which_1.ptr.field_1.value.index < field.index)) {
        kj::Vector<kj::StringTree>::add<kj::StringTree>(&printedFields,&unionValue);
        if (which_1.ptr.isSet == true) {
          which_1.ptr._0_8_ = which_1.ptr._0_8_ & 0xffffffffffffff00;
        }
      }
      field_02.index = field.index;
      field_02._12_4_ = field._12_4_;
      field_02.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
      field_02.proto._reader.segment = field.proto._reader.segment;
      field_02.proto._reader.capTable = field.proto._reader.capTable;
      field_02.proto._reader.data = field.proto._reader.data;
      field_02.proto._reader.pointers = field.proto._reader.pointers;
      field_02.proto._reader.dataSize = field.proto._reader.dataSize;
      field_02.proto._reader.pointerCount = field.proto._reader.pointerCount;
      field_02.proto._reader._38_2_ = field.proto._reader._38_2_;
      field_02.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
      field_02.proto._reader._44_4_ = field.proto._reader._44_4_;
      bVar11 = DynamicStruct::Reader::has(&structValue,field_02,NON_NULL);
      if (bVar11) {
        local_108 = field.proto._reader.dataSize;
        SStack_104 = field.proto._reader.pointerCount;
        uStack_102 = field.proto._reader._38_2_;
        iStack_100 = field.proto._reader.nestingLimit;
        uStack_fc = field.proto._reader._44_4_;
        local_118 = field.proto._reader.data;
        pWStack_110 = field.proto._reader.pointers;
        local_128.size_ = (size_t)field.proto._reader.capTable;
        local_128.ptr = (char *)field.proto._reader.segment;
        local_1d0 = (ArrayPtr<const_char>)
                    capnp::schema::Field::Reader::getName((Reader *)&local_128);
        field_03.index = field.index;
        field_03._12_4_ = field._12_4_;
        field_03.parent = (StructSchema)(StructSchema)field.parent.super_Schema.raw;
        field_03.proto._reader.segment = field.proto._reader.segment;
        field_03.proto._reader.capTable = field.proto._reader.capTable;
        field_03.proto._reader.data = field.proto._reader.data;
        field_03.proto._reader.pointers = field.proto._reader.pointers;
        field_03.proto._reader.dataSize = field.proto._reader.dataSize;
        field_03.proto._reader.pointerCount = field.proto._reader.pointerCount;
        field_03.proto._reader._38_2_ = field.proto._reader._38_2_;
        field_03.proto._reader.nestingLimit = field.proto._reader.nestingLimit;
        field_03.proto._reader._44_4_ = field.proto._reader._44_4_;
        DynamicStruct::Reader::get((Reader *)&builder,&structValue,field_03);
        WVar5 = whichFieldType(&field);
        pSVar10 = (StringTree *)0x1;
        print((StringTree *)&fieldProto,(Reader *)&builder,WVar5,IVar7,PREFIXED);
        kj::strTree<capnp::Text::Reader,char_const(&)[4],kj::StringTree>
                  (&local_b8,(kj *)&local_1d0,(Reader *)" = ",(char (*) [4])&fieldProto,pSVar10);
        kj::Vector<kj::StringTree>::add<kj::StringTree>(&printedFields,&local_b8);
        kj::StringTree::~StringTree(&local_b8);
        kj::StringTree::~StringTree((StringTree *)&fieldProto);
        DynamicValue::Reader::~Reader((Reader *)&builder);
      }
    }
    if (which_1.ptr.isSet == true) {
      kj::Vector<kj::StringTree>::add<kj::StringTree>(&printedFields,&unionValue);
    }
    field.parent.super_Schema.raw._0_1_ = 0x28;
    kj::Vector<kj::StringTree>::releaseAsArray(&local_1c0,&printedFields);
    pcVar8 = (char *)0x1;
    Indent::delimit((StringTree *)&builder,&indent_local,&local_1c0,mode,RECORD);
    local_b8.size_._0_1_ = 0x29;
    kj::strTree<char,kj::StringTree,char>
              (__return_storage_ptr__,(kj *)&field,(char *)&builder,&local_b8,pcVar8);
    kj::StringTree::~StringTree((StringTree *)&builder);
    kj::Array<kj::StringTree>::~Array(&local_1c0);
    kj::StringTree::~StringTree(&unionValue);
    kj::ArrayBuilder<kj::StringTree>::dispose(&printedFields.builder);
    break;
  case CAPABILITY:
    kj::strTree<char_const(&)[22]>(__return_storage_ptr__,(kj *)"<external capability>",params);
    break;
  case ANY_POINTER:
    kj::strTree<char_const(&)[17]>
              (__return_storage_ptr__,(kj *)"<opaque pointer>",(char (*) [17])params);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

static kj::StringTree print(const DynamicValue::Reader& value,
                            schema::Type::Which which, Indent indent,
                            PrintMode mode) {
  switch (value.getType()) {
    case DynamicValue::UNKNOWN:
      return kj::strTree("?");
    case DynamicValue::VOID:
      return kj::strTree("void");
    case DynamicValue::BOOL:
      return kj::strTree(value.as<bool>() ? "true" : "false");
    case DynamicValue::INT:
      return kj::strTree(value.as<int64_t>());
    case DynamicValue::UINT:
      return kj::strTree(value.as<uint64_t>());
    case DynamicValue::FLOAT:
      if (which == schema::Type::FLOAT32) {
        return kj::strTree(value.as<float>());
      } else {
        return kj::strTree(value.as<double>());
      }
    case DynamicValue::TEXT: {
      kj::ArrayPtr<const char> chars = value.as<Text>();
      return kj::strTree('"', kj::encodeCEscape(chars), '"');
    }
    case DynamicValue::DATA: {
      // TODO(someday): Maybe data should be printed as binary literal.
      kj::ArrayPtr<const byte> bytes = value.as<Data>().asBytes();
      return kj::strTree('"', kj::encodeCEscape(bytes), '"');
    }
    case DynamicValue::LIST: {
      auto listValue = value.as<DynamicList>();
      auto which = listValue.getSchema().whichElementType();
      kj::Array<kj::StringTree> elements = KJ_MAP(element, listValue) {
        return print(element, which, indent.next(), BARE);
      };
      return kj::strTree('[', indent.delimit(kj::mv(elements), mode, PrintKind::LIST), ']');
    }
    case DynamicValue::ENUM: {
      auto enumValue = value.as<DynamicEnum>();
      KJ_IF_SOME(enumerant, enumValue.getEnumerant()) {
        return kj::strTree(enumerant.getProto().getName());
      } else {
        // Unknown enum value; output raw number.
        return kj::strTree('(', enumValue.getRaw(), ')');
      }
      break;
    }
    case DynamicValue::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto unionFields = structValue.getSchema().getUnionFields();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      kj::Vector<kj::StringTree> printedFields(nonUnionFields.size() + (unionFields.size() != 0));

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();

      kj::StringTree unionValue;
      KJ_IF_SOME(field, which) {
        // Even if the union field has its default value, if it is not the default field of the
        // union then we have to print it anyway.
        auto fieldProto = field.getProto();
        if (fieldProto.getDiscriminantValue() != 0 || structValue.has(field)) {
          unionValue = kj::strTree(
              fieldProto.getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED));
        } else {
          which = kj::none;
        }
      }

      for (auto field: nonUnionFields) {
        KJ_IF_SOME(unionField, which) {
          if (unionField.getIndex() < field.getIndex()) {
            printedFields.add(kj::mv(unionValue));
            which = kj::none;
          }
        }
        if (structValue.has(field)) {
          printedFields.add(kj::strTree(
              field.getProto().getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED)));
        }
      }
      if (which != kj::none) {
        // Union value is last.
        printedFields.add(kj::mv(unionValue));
      }

      if (mode == PARENTHESIZED) {
        return indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD);
      } else {
        return kj::strTree(
            '(', indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD), ')');
      }
    }
    case DynamicValue::CAPABILITY:
      return kj::strTree("<external capability>");
    case DynamicValue::ANY_POINTER:
      return kj::strTree("<opaque pointer>");
  }